

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TextClassifier.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::CoreMLModels::TextClassifier::SerializeWithCachedSizes
          (TextClassifier *this,CodedOutputStream *output)

{
  string *psVar1;
  size_type sVar2;
  
  if (this->revision_ != 0) {
    google::protobuf::internal::WireFormatLite::WriteUInt32(1,this->revision_,output);
  }
  psVar1 = (this->language_).ptr_;
  sVar2 = psVar1->_M_string_length;
  if (sVar2 != 0) {
    google::protobuf::internal::WireFormatLite::VerifyUtf8String
              ((psVar1->_M_dataplus)._M_p,(int)sVar2,SERIALIZE,
               "CoreML.Specification.CoreMLModels.TextClassifier.language");
    google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased
              (10,(this->language_).ptr_,output);
  }
  psVar1 = (this->modelparameterdata_).ptr_;
  if (psVar1->_M_string_length != 0) {
    google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(100,psVar1,output);
  }
  if (this->_oneof_case_[0] == 200) {
    google::protobuf::internal::WireFormatLite::WriteMessage
              (200,&((this->ClassLabels_).stringclasslabels_)->super_MessageLite,output);
    return;
  }
  return;
}

Assistant:

void TextClassifier::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.CoreMLModels.TextClassifier)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // uint32 revision = 1;
  if (this->revision() != 0) {
    ::google::protobuf::internal::WireFormatLite::WriteUInt32(1, this->revision(), output);
  }

  // string language = 10;
  if (this->language().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::VerifyUtf8String(
      this->language().data(), this->language().length(),
      ::google::protobuf::internal::WireFormatLite::SERIALIZE,
      "CoreML.Specification.CoreMLModels.TextClassifier.language");
    ::google::protobuf::internal::WireFormatLite::WriteStringMaybeAliased(
      10, this->language(), output);
  }

  // bytes modelParameterData = 100;
  if (this->modelparameterdata().size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteBytesMaybeAliased(
      100, this->modelparameterdata(), output);
  }

  // .CoreML.Specification.StringVector stringClassLabels = 200;
  if (has_stringclasslabels()) {
    ::google::protobuf::internal::WireFormatLite::WriteMessage(
      200, *ClassLabels_.stringclasslabels_, output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.CoreMLModels.TextClassifier)
}